

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.cpp
# Opt level: O3

bool duckdb::CastExpression::Equal(CastExpression *a,CastExpression *b)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  type pPVar4;
  
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&a->child);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&b->child);
  iVar2 = (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[10])(pPVar3,pPVar4);
  if (((char)iVar2 != '\0') && (bVar1 = LogicalType::operator==(&a->cast_type,&b->cast_type), bVar1)
     ) {
    return a->try_cast == b->try_cast;
  }
  return false;
}

Assistant:

bool CastExpression::Equal(const CastExpression &a, const CastExpression &b) {
	if (!a.child->Equals(*b.child)) {
		return false;
	}
	if (a.cast_type != b.cast_type) {
		return false;
	}
	if (a.try_cast != b.try_cast) {
		return false;
	}
	return true;
}